

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getnameinfo.c
# Opt level: O0

int run_test_getnameinfo_basic_ip4(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  int r;
  
  iVar1 = uv_ip4_addr(address_ip4,0x50,&addr4);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getnameinfo.c"
            ,0x34,"r == 0");
    abort();
  }
  uVar2 = uv_default_loop();
  iVar1 = uv_getnameinfo(uVar2,&req,getnameinfo_req,&addr4,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getnameinfo.c"
            ,0x3b,"r == 0");
    abort();
  }
  uVar2 = uv_default_loop();
  uv_run(uVar2,0);
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getnameinfo.c"
            ,0x3f,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(getnameinfo_basic_ip4) {
  int r;

  r = uv_ip4_addr(address_ip4, port, &addr4);
  ASSERT(r == 0);

  r = uv_getnameinfo(uv_default_loop(),
                     &req,
                     &getnameinfo_req,
                     (const struct sockaddr*)&addr4,
                     0);
  ASSERT(r == 0);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY();
  return 0;
}